

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

iobject * __thiscall network::get_object(network *this,int netid)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator it;
  int netid_local;
  network *this_local;
  
  it._M_node._4_4_ = netid;
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_iobject_*,_std::less<int>,_std::allocator<std::pair<const_int,_iobject_*>_>_>::
       find(&this->objects_,(key_type *)((long)&it._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_iobject_*,_std::less<int>,_std::allocator<std::pair<const_int,_iobject_*>_>_>::
       end(&this->objects_);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local = (network *)0x0;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_iobject_*>_>::operator->(&local_28);
    this_local = (network *)ppVar2->second;
  }
  return (iobject *)this_local;
}

Assistant:

iobject* network::get_object(int netid)
{
    object_map::iterator it = objects_.find(netid);
    if (it == objects_.end())
    {
        return NULL;
    }
    return it->second;
}